

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcElementComponentType,_0UL>::
         Construct(DB *db,LIST *params)

{
  IfcElementType *this;
  
  this = (IfcElementType *)operator_new(0x1a8);
  *(undefined ***)&this->field_0x190 = &PTR__Object_00816a50;
  *(undefined8 *)&this[1].super_IfcTypeProduct.super_IfcTypeObject = 0;
  *(char **)&this[1].super_IfcTypeProduct.super_IfcTypeObject.field_0x8 = "IfcElementComponentType";
  Assimp::IFC::Schema_2x3::IfcElementType::IfcElementType
            (this,&PTR_construction_vtable_24__0086a6d8);
  *(undefined ***)&(this->super_IfcTypeProduct).super_IfcTypeObject =
       &PTR__IfcElementComponentType_0086a5d0;
  *(undefined ***)&this->field_0x190 = &PTR__IfcElementComponentType_0086a6c0;
  *(undefined ***)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x88 =
       &PTR__IfcElementComponentType_0086a5f8;
  (this->super_IfcTypeProduct).super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcElementComponentType_0086a620;
  *(undefined ***)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0xf0 =
       &PTR__IfcElementComponentType_0086a648;
  *(undefined ***)&(this->super_IfcTypeProduct).field_0x148 = &PTR__IfcElementComponentType_0086a670
  ;
  *(undefined ***)&this->field_0x180 = &PTR__IfcElementComponentType_0086a698;
  GenericFill<Assimp::IFC::Schema_2x3::IfcObjectDefinition>(db,params,(IfcObjectDefinition *)this);
  return (Object *)
         (&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x0 +
         *(long *)(*(long *)&(this->super_IfcTypeProduct).super_IfcTypeObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }